

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShuffledDeckGenerator.cpp
# Opt level: O0

Deck * __thiscall
solitaire::cards::ShuffledDeckGenerator::generate
          (Deck *__return_storage_ptr__,ShuffledDeckGenerator *this)

{
  result_type_conflict rVar1;
  iterator __first;
  iterator __last;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_13a0;
  default_random_engine dre;
  random_device rd;
  ShuffledDeckGenerator *this_local;
  
  generateSortedDeck(__return_storage_ptr__,this);
  std::random_device::random_device((random_device *)&dre);
  rVar1 = std::random_device::operator()((random_device *)&dre);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine(&local_13a0,(ulong)rVar1);
  __first = std::begin<std::array<solitaire::cards::Card,52ul>>(__return_storage_ptr__);
  __last = std::end<std::array<solitaire::cards::Card,52ul>>(__return_storage_ptr__);
  std::
  shuffle<solitaire::cards::Card*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
            (__first,__last,&local_13a0);
  std::random_device::~random_device((random_device *)&dre);
  return __return_storage_ptr__;
}

Assistant:

Deck ShuffledDeckGenerator::generate() const {
    auto generatedDeck = generateSortedDeck();
    auto rd = std::random_device {};
    auto dre = std::default_random_engine {rd()};
    std::shuffle(std::begin(generatedDeck), std::end(generatedDeck), dre);
    return generatedDeck;
}